

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O0

void __thiscall
DIS::StandardVariableSpecification::marshal
          (StandardVariableSpecification *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_80 [8];
  SimulationManagementPduHeader x;
  size_t idx;
  DataStream *dataStream_local;
  StandardVariableSpecification *this_local;
  
  sVar2 = std::
          vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
          ::size(&this->_standardVariables);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  x._recevingID._entityNumber = 0;
  x._recevingID._26_6_ = 0;
  while( true ) {
    uVar1 = x._recevingID._24_8_;
    sVar2 = std::
            vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
            ::size(&this->_standardVariables);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::
             vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
             ::operator[](&this->_standardVariables,x._recevingID._24_8_);
    SimulationManagementPduHeader::SimulationManagementPduHeader
              ((SimulationManagementPduHeader *)local_80,pvVar3);
    SimulationManagementPduHeader::marshal((SimulationManagementPduHeader *)local_80,dataStream);
    SimulationManagementPduHeader::~SimulationManagementPduHeader
              ((SimulationManagementPduHeader *)local_80);
    x._recevingID._24_8_ = x._recevingID._24_8_ + 1;
  }
  return;
}

Assistant:

void StandardVariableSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned short )_standardVariables.size();

     for(size_t idx = 0; idx < _standardVariables.size(); idx++)
     {
        SimulationManagementPduHeader x = _standardVariables[idx];
        x.marshal(dataStream);
     }

}